

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word Gia_ObjComputeTruth6(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp,Vec_Wrd_t *vTemp)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int local_2c;
  int Fanin;
  int i;
  Vec_Wrd_t *vTemp_local;
  Vec_Int_t *vSupp_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vTemp);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x154,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
  }
  iVar1 = Vec_IntSize(vSupp);
  if (6 < iVar1) {
    __assert_fail("Vec_IntSize(vSupp) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                  ,0x155,"word Gia_ObjComputeTruth6(Gia_Man_t *, int, Vec_Int_t *, Vec_Wrd_t *)");
  }
  Gia_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Vec_IntSize(vSupp), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vSupp,local_2c);
    Gia_ObjSetTravIdCurrentId(p,iVar1);
    Vec_WrdWriteEntry(vTemp,iVar1,s_Truth6[local_2c]);
  }
  Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
  wVar3 = Vec_WrdEntry(vTemp,iObj);
  return wVar3;
}

Assistant:

word Gia_ObjComputeTruth6( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(vSupp) <= 6 );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSupp, Fanin, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Fanin );
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    }
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}